

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cui.hpp
# Opt level: O1

void __thiscall ghc::cui::window_base::drawBox(window_base *this,int x,int y,int w,int h)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  if (1 < h && 1 < w) {
    iVar1 = wmove(_stdscr,this->_ypos + y,this->_xpos + x);
    if (iVar1 != -1) {
      waddch(_stdscr,_curs_set);
    }
    iVar1 = x + w;
    iVar2 = wmove(_stdscr,this->_ypos + y,this->_xpos + iVar1 + -1);
    if (iVar2 != -1) {
      waddch(_stdscr,_DAT_0021f47c);
    }
    iVar3 = h + y;
    iVar2 = wmove(_stdscr,this->_ypos + iVar3 + -1,this->_xpos + x);
    if (iVar2 != -1) {
      waddch(_stdscr,_DAT_0021f484);
    }
    iVar2 = wmove(_stdscr,this->_ypos + iVar3 + -1,this->_xpos + iVar1 + -1);
    if (iVar2 != -1) {
      waddch(_stdscr,__M_widen_init);
    }
    iVar2 = wmove(_stdscr,this->_ypos + y,this->_xpos + x + 1);
    if (iVar2 != -1) {
      whline(_stdscr,_DAT_0021f494,w + -2);
    }
    iVar2 = wmove(_stdscr,this->_ypos + iVar3 + -1,x + 1 + this->_xpos);
    if (iVar2 != -1) {
      whline(_stdscr,_DAT_0021f494,w + -2);
    }
    iVar2 = wmove(_stdscr,this->_ypos + y + 1,x + this->_xpos);
    if (iVar2 != -1) {
      wvline(_stdscr,__M_insert<unsigned_long>,h + -2);
    }
    iVar1 = wmove(_stdscr,y + 1 + this->_ypos,this->_xpos + iVar1 + -1);
    if (iVar1 != -1) {
      wvline(_stdscr,__M_insert<unsigned_long>,h + -2);
      return;
    }
  }
  return;
}

Assistant:

GHC_INLINE void window_base::drawBox(int x, int y, int w, int h)
{
    if (w >= 2 && h >= 2) {
        mvaddch(_ypos + y, _xpos + x, ACS_ULCORNER);
        mvaddch(_ypos + y, _xpos + x + w - 1, ACS_URCORNER);
        mvaddch(_ypos + y + h - 1, _xpos + x, ACS_LLCORNER);
        mvaddch(_ypos + y + h - 1, _xpos + x + w - 1, ACS_LRCORNER);
        drawHLine(x + 1, y, w - 2);
        drawHLine(x + 1, y + h - 1, w - 2);
        drawVLine(x, y + 1, h - 2);
        drawVLine(x + w - 1, y + 1, h - 2);
    }
}